

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall SWDSimulationDataGenerator::OutputLineReset(SWDSimulationDataGenerator *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 0x37;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    OutputWriteBit(this,BIT_HIGH);
  }
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    OutputWriteBit(this,BIT_LOW);
  }
  AdvanceAllBySec(this,4.9999999999999996e-06);
  return;
}

Assistant:

void SWDSimulationDataGenerator::OutputLineReset()
{
    int cnt;

    // 55 ones
    for( cnt = 0; cnt < 55; ++cnt )
        OutputWriteBit( BIT_HIGH );

    // 10 zeros
    for( cnt = 0; cnt < 10; ++cnt )
        OutputWriteBit( BIT_LOW );

    // pause
    AdvanceAllBySec( TENTH_US * 50 );
}